

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask16_16(uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
  puVar1 = out + 8;
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  vpmovsxbd_avx2(ZEXT816(0x3c342c241c140c04));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  auVar3 = vpslld_avx2(auVar3,0x10);
  auVar2 = vpor_avx2(auVar3,auVar2);
  *(undefined1 (*) [32])out = auVar2;
  return puVar1;
}

Assistant:

uint32_t *__fastpackwithoutmask16_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}